

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O1

void __thiscall TTTBoard::DrawBoard(TTTBoard *this)

{
  CellType CVar1;
  ostream *poVar2;
  char local_39;
  char local_38;
  char local_37;
  char local_36;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  CVar1 = this->m_board[0][0];
  local_39 = ' ';
  if (CVar1 == OHS) {
    local_39 = 'O';
  }
  if (CVar1 == EXXES) {
    local_39 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_39,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
  CVar1 = this->m_board[0][1];
  local_38 = ' ';
  if (CVar1 == OHS) {
    local_38 = 'O';
  }
  if (CVar1 == EXXES) {
    local_38 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_38,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
  CVar1 = this->m_board[0][2];
  local_37 = ' ';
  if (CVar1 == OHS) {
    local_37 = 'O';
  }
  if (CVar1 == EXXES) {
    local_37 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_37,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-----",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  CVar1 = this->m_board[1][0];
  local_36 = ' ';
  if (CVar1 == OHS) {
    local_36 = 'O';
  }
  if (CVar1 == EXXES) {
    local_36 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_36,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
  CVar1 = this->m_board[1][1];
  local_35 = ' ';
  if (CVar1 == OHS) {
    local_35 = 'O';
  }
  if (CVar1 == EXXES) {
    local_35 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_35,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
  CVar1 = this->m_board[1][2];
  local_34 = ' ';
  if (CVar1 == OHS) {
    local_34 = 'O';
  }
  if (CVar1 == EXXES) {
    local_34 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_34,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"-----",5);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  CVar1 = this->m_board[2][0];
  local_33 = ' ';
  if (CVar1 == OHS) {
    local_33 = 'O';
  }
  if (CVar1 == EXXES) {
    local_33 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_33,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
  CVar1 = this->m_board[2][1];
  local_32 = ' ';
  if (CVar1 == OHS) {
    local_32 = 'O';
  }
  if (CVar1 == EXXES) {
    local_32 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_32,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"|",1);
  CVar1 = this->m_board[2][2];
  local_31 = ' ';
  if (CVar1 == OHS) {
    local_31 = 'O';
  }
  if (CVar1 == EXXES) {
    local_31 = 'X';
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_31,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void TTTBoard::DrawBoard() const
{
    cout << PrintCell(m_board[0][0]) << "|"
         << PrintCell(m_board[0][1]) << "|"
         << PrintCell(m_board[0][2]) << endl;

    cout << "-----" << endl;

    cout << PrintCell(m_board[1][0]) << "|"
         << PrintCell(m_board[1][1]) << "|"
         << PrintCell(m_board[1][2]) << endl;

    cout << "-----" << endl;

    cout << PrintCell(m_board[2][0]) << "|"
         << PrintCell(m_board[2][1]) << "|"
         << PrintCell(m_board[2][2]) << endl;
}